

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O2

string * __thiscall
upb::generator::ArchDependentSize_abi_cxx11_
          (string *__return_storage_ptr__,generator *this,int64_t size32,int64_t size64)

{
  AlphaNum *a;
  Arg *in_R9;
  string_view format;
  AlphaNum local_80;
  Arg local_50;
  
  if (this == (generator *)size32) {
    absl::lts_20250127::AlphaNum::AlphaNum(&local_80,(long)this);
    absl::lts_20250127::StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20250127 *)&local_80,a);
  }
  else {
    absl::lts_20250127::substitute_internal::Arg::Arg((Arg *)&local_80,(long)this);
    absl::lts_20250127::substitute_internal::Arg::Arg(&local_50,size32);
    format._M_str = (char *)&local_80;
    format._M_len = (size_t)"UPB_SIZE($0, $1)";
    absl::lts_20250127::Substitute_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)0x10,format,&local_50,in_R9);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ArchDependentSize(int64_t size32, int64_t size64) {
  if (size32 == size64) return absl::StrCat(size32);
  return absl::Substitute("UPB_SIZE($0, $1)", size32, size64);
}